

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O1

int32_t __thiscall
icu_63::UCharsTrieBuilder::writeValueAndFinal(UCharsTrieBuilder *this,int32_t i,UBool isFinal)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined2 uVar1;
  int iVar2;
  uint uVar3;
  undefined8 in_RAX;
  ssize_t sVar4;
  undefined2 *puVar5;
  undefined7 in_register_00000011;
  UChar intUnits [3];
  undefined8 uStack_8;
  
  if ((uint)i < 0x4000) {
    UNRECOVERED_JUMPTABLE = (this->super_StringTrieBuilder).super_UObject._vptr_UObject[0xf];
    iVar2 = (*UNRECOVERED_JUMPTABLE)
                      (this,(ulong)(uint)((int)isFinal << 0xf | i),
                       CONCAT71(in_register_00000011,isFinal),UNRECOVERED_JUMPTABLE);
    return iVar2;
  }
  uStack_8._0_2_ = (undefined2)in_RAX;
  uStack_8._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
  uVar1 = (undefined2)((uint)i >> 0x10);
  if ((uint)i < 0x3fff0000) {
    puVar5 = (undefined2 *)((long)&uStack_8 + 4);
    uStack_8 = CONCAT44(uStack_8._4_4_,CONCAT22(uVar1,(undefined2)uStack_8)) | 0x40000000;
    uVar3 = 2;
  }
  else {
    puVar5 = (undefined2 *)((long)&uStack_8 + 6);
    uStack_8._0_4_ = CONCAT22(0x7fff,(undefined2)uStack_8);
    uStack_8._6_2_ = (undefined2)((ulong)in_RAX >> 0x30);
    uStack_8._0_6_ = CONCAT24(uVar1,(undefined4)uStack_8);
    uVar3 = 3;
  }
  *puVar5 = (short)i;
  uStack_8._0_4_ = CONCAT22(uStack_8._2_2_ | (ushort)(byte)isFinal << 0xf,(undefined2)uStack_8);
  sVar4 = write(this,(int)&uStack_8 + 2,(void *)(ulong)uVar3,(ulong)(byte)isFinal << 0xf);
  return (int32_t)sVar4;
}

Assistant:

int32_t
UCharsTrieBuilder::writeValueAndFinal(int32_t i, UBool isFinal) {
    if(0<=i && i<=UCharsTrie::kMaxOneUnitValue) {
        return write(i|(isFinal<<15));
    }
    UChar intUnits[3];
    int32_t length;
    if(i<0 || i>UCharsTrie::kMaxTwoUnitValue) {
        intUnits[0]=(UChar)(UCharsTrie::kThreeUnitValueLead);
        intUnits[1]=(UChar)((uint32_t)i>>16);
        intUnits[2]=(UChar)i;
        length=3;
    // } else if(i<=UCharsTrie::kMaxOneUnitValue) {
    //     intUnits[0]=(UChar)(i);
    //     length=1;
    } else {
        intUnits[0]=(UChar)(UCharsTrie::kMinTwoUnitValueLead+(i>>16));
        intUnits[1]=(UChar)i;
        length=2;
    }
    intUnits[0]=(UChar)(intUnits[0]|(isFinal<<15));
    return write(intUnits, length);
}